

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringWrapperExample.cpp
# Opt level: O2

ostream * toStringForMultipleLines(ostream *os,Rectangle3 *rectangle)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"(x,y,width,height) = (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->y);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->width);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rectangle->height);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream& toStringForMultipleLines(std::ostream& os, const Rectangle3& rectangle)
{
    os << "(x,y,width,height) = (" << rectangle.x << "," << rectangle.y << ","
       << rectangle.width << "," << rectangle.height << ")";
    return os;
}